

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiledata-window.cc
# Opt level: O0

void __thiscall Debugger::TiledataWindow::CalculateAutoObjPaletteIndex(TiledataWindow *this)

{
  u8 uVar1;
  Bool BVar2;
  uint local_34;
  int pal_index;
  int tile_index;
  bool visible;
  Obj obj;
  int obj_index;
  ObjSize obj_size;
  TiledataWindow *this_local;
  
  obj._16_4_ = emulator_get_obj_size(((this->super_Window).d)->e);
  for (obj.xflip = FALSE; (int)obj.xflip < 0x28; obj.xflip = obj.xflip + TRUE) {
    emulator_get_obj((Obj *)&tile_index,((this->super_Window).d)->e,obj.xflip);
    BVar2 = obj_is_visible((Obj *)&tile_index);
    if (BVar2 != FALSE) {
      local_34 = (uint)tile_index._2_1_;
      if ((((this->super_Window).d)->is_cgb & 1U) == 0) {
        if ((((this->super_Window).d)->is_sgb & 1U) == 0) {
          uVar1 = (undefined1)obj.yflip + 2;
        }
        else {
          uVar1 = (undefined1)obj.yflip + 5;
        }
      }
      else {
        if (obj.yflip._1_1_ != FALSE >> 8) {
          local_34 = local_34 + 0x180;
        }
        uVar1 = obj.yflip._2_1_ + 9;
      }
      if (obj._16_4_ == 1) {
        this->tile_palette_index[(int)(local_34 & 0xfffffffe)] = uVar1;
        this->tile_palette_index[(int)(local_34 | 1)] = uVar1;
      }
      else {
        this->tile_palette_index[(int)local_34] = uVar1;
      }
    }
  }
  return;
}

Assistant:

void Debugger::TiledataWindow::CalculateAutoObjPaletteIndex() {
  ObjSize obj_size = emulator_get_obj_size(d->e);
  for (int obj_index = 0; obj_index < 40; ++obj_index) {
    Obj obj = emulator_get_obj(d->e, obj_index);
    bool visible = static_cast<bool>(obj_is_visible(&obj));
    if (visible) {
      int tile_index = obj.tile;
      int pal_index = 0;
      if (d->is_cgb) {
        if (obj.bank) {
          tile_index += 0x180;
        }
        pal_index = 9 + obj.cgb_palette;
      } else if (d->is_sgb) {
        pal_index = 5 + obj.palette;
      } else {
        pal_index = 2 + obj.palette;
      }

      if (obj_size == OBJ_SIZE_8X16) {
        tile_palette_index[tile_index & ~1] = pal_index;
        tile_palette_index[tile_index | 1] = pal_index;
      } else {
        tile_palette_index[tile_index] = pal_index;
      }
    }
  }
}